

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtree.c
# Opt level: O0

void g_tree_insert_internal(GTree *tree,gpointer key,gpointer value,gboolean replace)

{
  gint gVar1;
  GTreeNode *pGVar2;
  bool bVar3;
  gboolean left_node;
  GTreeNode *bparent;
  GTreeNode *child_1;
  GTreeNode *child;
  int cmp;
  int idx;
  GTreeNode *path [40];
  GTreeNode *local_30;
  GTreeNode *node;
  gboolean replace_local;
  gpointer value_local;
  gpointer key_local;
  GTree *tree_local;
  
  if (tree->root == (GTreeNode *)0x0) {
    pGVar2 = g_tree_node_new(key,value);
    tree->root = pGVar2;
    tree->nnodes = tree->nnodes + 1;
    return;
  }
  child._4_4_ = 1;
  _cmp = 0;
  local_30 = tree->root;
  do {
    gVar1 = (*tree->key_compare)(key,local_30->key,tree->key_compare_data);
    if (gVar1 == 0) {
      if (tree->value_destroy_func != (GDestroyNotify)0x0) {
        (*tree->value_destroy_func)(local_30->value);
      }
      local_30->value = value;
      if (replace == 0) {
        if (tree->key_destroy_func != (GDestroyNotify)0x0) {
          (*tree->key_destroy_func)(key);
        }
      }
      else {
        if (tree->key_destroy_func != (GDestroyNotify)0x0) {
          (*tree->key_destroy_func)(local_30->key);
        }
        local_30->key = key;
      }
      return;
    }
    if (gVar1 < 0) {
      if (local_30->left_child == '\0') {
        pGVar2 = g_tree_node_new(key,value);
        pGVar2->left = local_30->left;
        pGVar2->right = local_30;
        local_30->left = pGVar2;
        local_30->left_child = '\x01';
        local_30->balance = local_30->balance + -1;
        tree->nnodes = tree->nnodes + 1;
        goto LAB_004a8d19;
      }
      *(GTreeNode **)(&cmp + (long)child._4_4_ * 2) = local_30;
      local_30 = local_30->left;
    }
    else {
      if (local_30->right_child == '\0') {
        pGVar2 = g_tree_node_new(key,value);
        pGVar2->right = local_30->right;
        pGVar2->left = local_30;
        local_30->right = pGVar2;
        local_30->right_child = '\x01';
        local_30->balance = local_30->balance + '\x01';
        tree->nnodes = tree->nnodes + 1;
LAB_004a8d19:
        while( true ) {
          child._4_4_ = child._4_4_ + -1;
          pGVar2 = *(GTreeNode **)(&cmp + (long)child._4_4_ * 2);
          bVar3 = false;
          if (pGVar2 != (GTreeNode *)0x0) {
            bVar3 = local_30 == pGVar2->left;
          }
          if ((local_30->balance < -1) || ('\x01' < local_30->balance)) {
            local_30 = g_tree_node_balance(local_30);
            if (pGVar2 == (GTreeNode *)0x0) {
              tree->root = local_30;
            }
            else if (bVar3) {
              pGVar2->left = local_30;
            }
            else {
              pGVar2->right = local_30;
            }
          }
          if (local_30->balance == '\0') break;
          if (pGVar2 == (GTreeNode *)0x0) {
            return;
          }
          local_30 = pGVar2;
          if (bVar3) {
            pGVar2->balance = pGVar2->balance + -1;
          }
          else {
            pGVar2->balance = pGVar2->balance + '\x01';
          }
        }
        return;
      }
      *(GTreeNode **)(&cmp + (long)child._4_4_ * 2) = local_30;
      local_30 = local_30->right;
    }
    child._4_4_ = child._4_4_ + 1;
  } while( true );
}

Assistant:

static void g_tree_insert_internal (GTree *tree, gpointer key, gpointer value, gboolean replace)
{
    GTreeNode *node;
    GTreeNode *path[MAX_GTREE_HEIGHT];
    int idx;

    g_return_if_fail (tree != NULL);

    if (!tree->root)
    {
        tree->root = g_tree_node_new (key, value);
        tree->nnodes++;
        return;
    }

    idx = 0;
    path[idx++] = NULL;
    node = tree->root;

    while (1)
    {
        int cmp = tree->key_compare (key, node->key, tree->key_compare_data);

        if (cmp == 0)
        {
            if (tree->value_destroy_func)
                tree->value_destroy_func (node->value);

            node->value = value;

            if (replace)
            {
                if (tree->key_destroy_func)
                    tree->key_destroy_func (node->key);

                node->key = key;
            }
            else
            {
                /* free the passed key */
                if (tree->key_destroy_func)
                    tree->key_destroy_func (key);
            }

            return;
        }
        else if (cmp < 0)
        {
            if (node->left_child)
            {
                path[idx++] = node;
                node = node->left;
            }
            else
            {
                GTreeNode *child = g_tree_node_new (key, value);

                child->left = node->left;
                child->right = node;
                node->left = child;
                node->left_child = TRUE;
                node->balance -= 1;

                tree->nnodes++;

                break;
            }
        }
        else
        {
            if (node->right_child)
            {
                path[idx++] = node;
                node = node->right;
            }
            else
            {
                GTreeNode *child = g_tree_node_new (key, value);

                child->right = node->right;
                child->left = node;
                node->right = child;
                node->right_child = TRUE;
                node->balance += 1;

                tree->nnodes++;

                break;
            }
        }
    }

    /* Restore balance. This is the goodness of a non-recursive
     * implementation, when we are done with balancing we 'break'
     * the loop and we are done.
     */
    while (1)
    {
        GTreeNode *bparent = path[--idx];
        gboolean left_node = (bparent && node == bparent->left);
        //g_assert (!bparent || bparent->left == node || bparent->right == node);

        if (node->balance < -1 || node->balance > 1)
        {
            node = g_tree_node_balance (node);
            if (bparent == NULL)
                tree->root = node;
            else if (left_node)
                bparent->left = node;
            else
                bparent->right = node;
        }

        if (node->balance == 0 || bparent == NULL)
            break;

        if (left_node)
            bparent->balance -= 1;
        else
            bparent->balance += 1;

        node = bparent;
    }
}